

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_>::clear
          (array<CCommandManager::CCommand,_allocator_default<CCommandManager::CCommand>_> *this)

{
  CCommand *pCVar1;
  CCommand *in_RDI;
  int in_stack_00000024;
  
  allocator_default<CCommandManager::CCommand>::free_array(in_RDI);
  in_RDI->m_aName[8] = '\x01';
  in_RDI->m_aName[9] = '\0';
  in_RDI->m_aName[10] = '\0';
  in_RDI->m_aName[0xb] = '\0';
  pCVar1 = allocator_default<CCommandManager::CCommand>::alloc_array(in_stack_00000024);
  *(CCommand **)in_RDI->m_aName = pCVar1;
  in_RDI->m_aName[0xc] = '\0';
  in_RDI->m_aName[0xd] = '\0';
  in_RDI->m_aName[0xe] = '\0';
  in_RDI->m_aName[0xf] = '\0';
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}